

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void R_FillAddColumn(void)

{
  DWORD DVar1;
  DWORD *pDVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  uint uVar6;
  
  pDVar2 = dc_destblend;
  DVar1 = dc_srccolor;
  if (0 < dc_count) {
    lVar5 = (long)dc_pitch;
    pbVar4 = dc_dest;
    iVar3 = dc_count;
    do {
      uVar6 = pDVar2[*pbVar4] + DVar1 | 0x1f07c1f;
      *pbVar4 = RGB32k.All[uVar6 >> 0xf & uVar6];
      pbVar4 = pbVar4 + lVar5;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void R_FillAddColumn (void)
{
	int count;
	BYTE *dest;

	count = dc_count;
	if (count <= 0)
		return;

	dest = dc_dest;
	DWORD *bg2rgb;
	DWORD fg;

	bg2rgb = dc_destblend;
	fg = dc_srccolor;
	int pitch = dc_pitch;

	do
	{
		DWORD bg;
		bg = (fg + bg2rgb[*dest]) | 0x1f07c1f;
		*dest = RGB32k.All[bg & (bg>>15)];
		dest += pitch; 
	} while (--count);

}